

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

ptrlen ntru_decode_ciphertext(uint16_t *ct,NTRUKeyPair *keypair,BinarySource *src)

{
  uint p_00;
  uint q_00;
  uint uVar1;
  NTRUEncodeSchedule *sched_00;
  size_t wanted;
  ptrlen data;
  size_t len;
  NTRUEncodeSchedule *sched;
  uint q;
  uint p;
  BinarySource *src_local;
  NTRUKeyPair *keypair_local;
  uint16_t *ct_local;
  ptrlen encoded;
  
  p_00 = keypair->p;
  q_00 = keypair->q;
  sched_00 = ntru_encode_ciphertext_schedule(p_00,q_00);
  wanted = ntru_encode_schedule_length(sched_00);
  data = BinarySource_get_data(src->binarysource_,wanted);
  if (src->binarysource_->err == BSE_NO_ERROR) {
    ntru_decode(sched_00,ct,data);
    ntru_encode_schedule_free(sched_00);
    ntru_scale(ct,ct,3,p_00,q_00);
    uVar1 = ciphertext_bias(q_00);
    ntru_bias(ct,ct,q_00 + uVar1 * -3,p_00,q_00);
  }
  else {
    memset(ct,0,(ulong)p_00 << 1);
  }
  return data;
}

Assistant:

ptrlen ntru_decode_ciphertext(uint16_t *ct, NTRUKeyPair *keypair,
                              BinarySource *src)
{
    unsigned p = keypair->p, q = keypair->q;

    NTRUEncodeSchedule *sched = ntru_encode_ciphertext_schedule(p, q);

    /* Retrieve the right number of bytes from the source */
    size_t len = ntru_encode_schedule_length(sched);
    ptrlen encoded = get_data(src, len);
    if (get_err(src)) {
        /* As above, return deterministic nonsense on failure */
        memset(ct, 0, p*sizeof(*ct));
    } else {
        /* Do the decoding */
        ntru_decode(sched, ct, encoded);
        ntru_encode_schedule_free(sched);

        /* Undo the scaling and bias */
        ntru_scale(ct, ct, 3, p, q);
        ntru_bias(ct, ct, q - 3 * ciphertext_bias(q), p, q);
    }

    return encoded;        /* also useful to the caller, optionally */
}